

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

void htmlCheckEncoding(htmlParserCtxtPtr ctxt,xmlChar *attvalue)

{
  xmlChar *pxVar1;
  byte *pbVar2;
  byte bVar3;
  
  pxVar1 = xmlStrcasestr(attvalue,"charset");
  if (pxVar1 != (xmlChar *)0x0) {
    pbVar2 = pxVar1 + 7;
    bVar3 = pxVar1[7];
    if (((ulong)bVar3 < 0x21) && ((0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
      pbVar2 = xmlStrcasestr(attvalue,"=");
      if (pbVar2 == (byte *)0x0) {
        return;
      }
      bVar3 = *pbVar2;
    }
    if (bVar3 == 0x3d) {
      htmlCheckEncodingDirect(ctxt,pbVar2 + 1);
      return;
    }
  }
  return;
}

Assistant:

static void
htmlCheckEncoding(htmlParserCtxtPtr ctxt, const xmlChar *attvalue) {
    const xmlChar *encoding;

    if (!attvalue)
	return;

    encoding = xmlStrcasestr(attvalue, BAD_CAST"charset");
    if (encoding != NULL) {
	encoding += 7;
    }
    /*
     * skip blank
     */
    if (encoding && IS_BLANK_CH(*encoding))
	encoding = xmlStrcasestr(attvalue, BAD_CAST"=");
    if (encoding && *encoding == '=') {
	encoding ++;
	htmlCheckEncodingDirect(ctxt, encoding);
    }
}